

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvalue.h
# Opt level: O2

Value * Kvm::isEqProc(Kvm *vm,Value *args)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  String *s2;
  long lVar3;
  bool bVar4;
  
  pp_Var1 = args[1]._vptr_Value;
  pp_Var2 = *(_func_int ***)(*(long *)&args[1].type_ + 0x18);
  if ((((ulong)pp_Var1 & 1) == 0) || (((ulong)pp_Var2 & 1) == 0)) {
    if ((((ulong)pp_Var1 & 2) == 0) || (((ulong)pp_Var2 & 2) == 0)) {
      lVar3 = 0x78;
      if ((((((ulong)pp_Var1 & 1) == 0) && (((ulong)pp_Var2 & 1) == 0)) &&
          ((((uint)pp_Var2 | (uint)pp_Var1) & 2) == 0)) &&
         (*(int *)(pp_Var1 + 1) == *(int *)(pp_Var2 + 1))) {
        if (*(int *)(pp_Var1 + 1) == 1) {
          bVar4 = pp_Var1[3] == pp_Var2[3];
        }
        else {
          bVar4 = pp_Var1 == pp_Var2;
        }
        lVar3 = (ulong)bVar4 * 8 + 0x78;
      }
      goto LAB_0010a644;
    }
    bVar4 = (((uint)pp_Var2 ^ (uint)pp_Var1) & 0x3fc) == 0;
  }
  else {
    bVar4 = ((ulong)pp_Var2 ^ (ulong)pp_Var1) < 2;
  }
  lVar3 = (ulong)bVar4 * 8 + 0x78;
LAB_0010a644:
  return *(Value **)((long)&(vm->interned_strings)._M_h._M_buckets + lVar3);
}

Assistant:

inline const Value* car(const Value *v)
{
    return static_cast<const Cell *>(v)->head_;
}